

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O1

Ssw_Man_t * Ssw_ManCreate(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  uint uVar1;
  Ssw_Man_t *__s;
  Aig_Obj_t **ppAVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  uint *puVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  
  if (0 < pAig->nRegs) {
    Aig_ManFanoutStart(pAig);
    Aig_ManSetCioIds(pAig);
    __s = (Ssw_Man_t *)malloc(0x1a8);
    memset(__s,0,0x1a8);
    __s->pPars = pPars;
    __s->pAig = pAig;
    lVar9 = (long)pPars->nFramesK + 1;
    iVar8 = (int)lVar9;
    __s->nFrames = iVar8;
    ppAVar2 = (Aig_Obj_t **)calloc(pAig->vObjs->nSize * lVar9,8);
    __s->pNodeToFrames = ppAVar2;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar3->pArray = ppvVar4;
    __s->vCommon = pVVar3;
    __s->iOutputLit = -1;
    uVar1 = pAig->nTruePis * iVar8 + pAig->nRegs;
    iVar8 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
    __s->nPatWords = iVar8;
    puVar5 = (uint *)calloc((long)iVar8,4);
    __s->pPatWords = puVar5;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar3->pArray = ppvVar4;
    __s->vNewLos = pVVar3;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    __s->vNewPos = pVVar6;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar3->pArray = ppvVar4;
    __s->vResimConsts = pVVar3;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar3->pArray = ppvVar4;
    __s->vResimClasses = pVVar3;
    return __s;
  }
  __assert_fail("Saig_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswMan.c"
                ,0x31,"Ssw_Man_t *Ssw_ManCreate(Aig_Man_t *, Ssw_Pars_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ssw_Man_t * Ssw_ManCreate( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Ssw_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Ssw_Man_t, 1 );
    memset( p, 0, sizeof(Ssw_Man_t) );
    p->pPars         = pPars;
    p->pAig          = pAig;
    p->nFrames       = pPars->nFramesK + 1;
    p->pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * p->nFrames );
    p->vCommon       = Vec_PtrAlloc( 100 );
    p->iOutputLit    = -1;
    // allocate storage for sim pattern
    p->nPatWords     = Abc_BitWordNum( Saig_ManPiNum(pAig) * p->nFrames + Saig_ManRegNum(pAig) );
    p->pPatWords     = ABC_CALLOC( unsigned, p->nPatWords );
    // other
    p->vNewLos       = Vec_PtrAlloc( 100 );
    p->vNewPos       = Vec_IntAlloc( 100 );
    p->vResimConsts  = Vec_PtrAlloc( 100 );
    p->vResimClasses = Vec_PtrAlloc( 100 );
//    p->pPars->fVerbose = 1;
    return p;
}